

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

int __thiscall ON_wString::RemoveWhiteSpace(ON_wString *this,wchar_t *whitespace)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  bool bVar3;
  int iVar4;
  ON_wStringHeader *pOVar5;
  wchar_t *pwVar6;
  wchar_t c;
  int n;
  wchar_t *s;
  wchar_t *s1;
  wchar_t *s0;
  wchar_t *whitespace_local;
  ON_wString *this_local;
  
  pwVar2 = this->m_s;
  if (pwVar2 == (wchar_t *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    iVar4 = Length(this);
    s1 = pwVar2;
    if ((whitespace == (wchar_t *)0x0) || (*whitespace == L'\0')) {
      do {
        if (pwVar2 + iVar4 <= s1) {
          return 0;
        }
        pwVar6 = s1 + 1;
        wVar1 = *s1;
      } while (((wVar1 < L'\x01') || (L' ' < wVar1)) && (s1 = pwVar6, wVar1 != L'\x7f'));
      pwVar2 = this->m_s;
      CopyArray(this);
      s1 = this->m_s + (int)((long)pwVar6 - (long)pwVar2 >> 2);
      _c = s1 + -1;
      pwVar2 = this->m_s;
      iVar4 = Length(this);
      for (; s1 < pwVar2 + iVar4; s1 = s1 + 1) {
        wVar1 = *s1;
        if ((wVar1 < L'\x01') || ((L' ' < wVar1 && (wVar1 != L'\x7f')))) {
          *_c = *s1;
          _c = _c + 1;
        }
      }
      *_c = L'\0';
      this_local._4_4_ = (int)((long)(pwVar2 + iVar4) - (long)_c >> 2);
      pOVar5 = Header(this);
      pOVar5->string_length = pOVar5->string_length - this_local._4_4_;
    }
    else {
      do {
        if (pwVar2 + iVar4 <= s1) {
          return 0;
        }
        pwVar6 = s1 + 1;
        bVar3 = IsWhiteSpaceHelper(*s1,whitespace);
        s1 = pwVar6;
      } while (!bVar3);
      pwVar2 = this->m_s;
      CopyArray(this);
      s1 = this->m_s + (int)((long)pwVar6 - (long)pwVar2 >> 2);
      _c = s1 + -1;
      pwVar2 = this->m_s;
      iVar4 = Length(this);
      for (; s1 < pwVar2 + iVar4; s1 = s1 + 1) {
        bVar3 = IsWhiteSpaceHelper(*s1,whitespace);
        if (!bVar3) {
          *_c = *s1;
          _c = _c + 1;
        }
      }
      *_c = L'\0';
      this_local._4_4_ = (int)((long)(pwVar2 + iVar4) - (long)_c >> 2);
      pOVar5 = Header(this);
      pOVar5->string_length = pOVar5->string_length - this_local._4_4_;
    }
  }
  return this_local._4_4_;
}

Assistant:

int ON_wString::RemoveWhiteSpace( const wchar_t* whitespace )
{
  wchar_t* s0;
  wchar_t* s1;
  wchar_t* s;
  int n;
  wchar_t c;

  if ( 0 == (s0 = m_s) )
    return 0;
  s1 = s0 + Length();
  if ( whitespace && *whitespace )
  {
    while( s0 < s1 )
    {
      if (IsWhiteSpaceHelper(*s0++,whitespace))
      {
        // need to modify this string
        n = ((int)(s0 - m_s)); // keep win64 happy with (int) cast
        CopyArray(); // may change m_s if string has multiple refs
        s0 = m_s + n;
        s = s0-1;
        s1 = m_s + Length();
        while ( s0 < s1 )
        {
          if ( !IsWhiteSpaceHelper(*s0,whitespace) )
          {
            *s++ = *s0;
          }
          s0++;
        }
        *s = 0;
        n = ((int)(s1 - s)); // keep win64 happy with (int) cast
        Header()->string_length -= n;
        return n;
      }
    }
  }
  else
  {
    while( s0 < s1 )
    {
      c = *s0++;
      if ( (1 <= c && c <= 32) || 127 == c )
      {
        // need to modify this string
        n = ((int)(s0 - m_s)); // keep win64 happy with (int) cast
        CopyArray(); // may change m_s if string has multiple refs
        s0 = m_s + n;
        s = s0-1;
        s1 = m_s + Length();
        while ( s0 < s1 )
        {
          c = *s0;
          if ( c < 1 || (c > 32 && 127 != c) )
          {
            *s++ = *s0;
          }
          s0++;
        }
        *s = 0;
        n = ((int)(s1 - s)); // keep win64 happy with (int) cast
        Header()->string_length -= n;
        return n;
      }
    }
  }
  return 0;
}